

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O0

void ht_thread_join(HT_Thread *th)

{
  bool bVar1;
  HT_Thread *th_local;
  
  bVar1 = std::thread::joinable(&th->th);
  if (bVar1) {
    std::thread::join();
  }
  return;
}

Assistant:

static void
ht_thread_join(HT_Thread* th)
{
#ifdef HT_THREAD_IMPL_CPP11
    if (th->th.joinable())
    {
        th->th.join();
    }
#elif defined(HT_THREAD_IMPL_POSIX)
    pthread_join(th->th, NULL);
#elif defined(HT_THREAD_IMPL_WIN32)
    WaitForSingleObject(th->th, INFINITE);
#endif
}